

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall
duckdb::Serializer::
WritePropertyWithDefault<duckdb::shared_ptr<duckdb::ParquetEncryptionConfig,true>>
          (Serializer *this,field_id_t field_id,char *tag,
          shared_ptr<duckdb::ParquetEncryptionConfig,_true> *value,
          shared_ptr<duckdb::ParquetEncryptionConfig,_true> *default_value)

{
  undefined1 uVar1;
  
  if ((this[9] == (Serializer)0x0) &&
     ((value->internal).
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (default_value->internal).
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
    uVar1 = 0;
    (**(code **)(*(long *)this + 0x20))(this,field_id,tag,0);
  }
  else {
    (**(code **)(*(long *)this + 0x20))(this,field_id,tag,1);
    WriteValue<duckdb::ParquetEncryptionConfig>
              (this,(value->internal).
                    super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
    uVar1 = 1;
  }
  (**(code **)(*(long *)this + 0x28))(this,uVar1);
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value, const T &default_value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && (value == default_value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}